

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManComputeForwardDirconCut(Of_Man_t *p,int iObj,int *pCut,int *pDelay1,int *pDelay2)

{
  int iVar1;
  int iVar2;
  Jf_Par_t *pJVar3;
  Of_Obj_t *pOVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int local_80;
  int local_7c;
  int Delays [6];
  int Perm [6];
  
  Perm[0] = 0;
  Perm[1] = 1;
  Perm[2] = 2;
  Perm[3] = 3;
  Perm[4] = 4;
  Perm[5] = 5;
  iVar1 = p->pPars->nDelayLut1;
  iVar2 = p->pPars->nDelayLut2;
  uVar6 = *pCut;
  uVar14 = uVar6 & 0x1f;
  uVar13 = 0;
  while ((uVar13 < (uVar6 & 0x1f) && (uVar6 = Of_CutVar(pCut,(int)uVar13), uVar6 != 0))) {
    Delays[uVar13] = p->pObjs[uVar6].Delay1 + iVar1;
    uVar13 = uVar13 + 1;
    uVar6 = *pCut;
  }
  pJVar3 = p->pPars;
  uVar6 = pJVar3->nLutSize;
  uVar9 = (ulong)uVar6;
  if ((int)uVar6 <= (int)uVar13) {
    uVar9 = uVar13 & 0xffffffff;
  }
  for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    Delays[uVar13] = -1000000000;
  }
  uVar6 = 1;
  if (1 < uVar14) {
    uVar6 = uVar14;
  }
  uVar13 = 1;
  for (uVar9 = 0; uVar9 != uVar6 - 1; uVar9 = uVar9 + 1) {
    uVar11 = uVar9 & 0xffffffff;
    for (uVar10 = uVar13; iVar7 = (int)uVar11, uVar14 != uVar10; uVar10 = uVar10 + 1) {
      uVar5 = uVar10 & 0xffffffff;
      if (Delays[uVar10] <= Delays[iVar7]) {
        uVar5 = uVar11;
      }
      uVar11 = uVar5;
    }
    iVar12 = Perm[uVar9];
    Perm[uVar9] = Perm[iVar7];
    iVar15 = Delays[uVar9];
    Delays[uVar9] = Delays[iVar7];
    Perm[iVar7] = iVar12;
    Delays[iVar7] = iVar15;
    uVar13 = uVar13 + 1;
  }
  if ((1 < uVar14) && (Delays[0] < Delays[uVar14 - 1])) {
    __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x52b,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  if ((Delays[0] < 0) || (Delays[(ulong)uVar14 - 1] < 0)) {
    __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x52c,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  *pDelay2 = 0;
  *pDelay1 = 0;
  iVar7 = pJVar3->nFastEdges;
  local_80 = 0;
  if (iVar7 < (int)uVar14) {
    local_80 = Delays[iVar7];
  }
  uVar13 = 0;
  local_7c = 1;
  do {
    if (uVar14 == uVar13) {
      iVar7 = *pDelay1;
      if (*pDelay2 < iVar7) {
        for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
          Of_CutSetFlag(pCut,uVar6,0);
        }
        iVar7 = *pDelay2;
        *pDelay1 = iVar7;
      }
      uVar6 = *pCut;
      pCut[(ulong)(uVar6 & 0x1f) + 1] = iVar7;
      pCut[(ulong)(uVar6 & 0x1f) + 2] = *pDelay2;
      uVar6 = 0;
      do {
        if ((*pCut & 0x1fU) <= uVar6) {
          return;
        }
        uVar14 = Of_CutVar(pCut,uVar6);
        if (uVar14 == 0) {
          return;
        }
        iVar7 = Of_CutFlag(pCut,uVar6);
        pOVar4 = p->pObjs;
        if (iVar7 == 0) {
          iVar7 = pOVar4[uVar14].Delay1 + iVar1;
          if (*pDelay1 < iVar7) {
            __assert_fail("Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x55c,
                          "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)"
                         );
          }
        }
        else {
          if (*pDelay1 < pOVar4[uVar14].Delay2 + iVar2) {
            __assert_fail("Of_ObjDelay2(p, iVar) + DelayLut2 <= *pDelay1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x55a,
                          "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)"
                         );
          }
          iVar7 = pOVar4[uVar14].Delay1 + iVar1;
        }
        uVar6 = uVar6 + 1;
      } while (iVar7 <= *pDelay2);
      __assert_fail("Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                    ,0x55d,
                    "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
    }
    iVar7 = Perm[uVar13];
    uVar6 = Of_CutVar(pCut,iVar7);
    iVar12 = Delays[uVar13];
    if (iVar12 != p->pObjs[uVar6].Delay1 + iVar1) {
      __assert_fail("Delays[k] == Of_ObjDelay1(p, iVar) + DelayLut1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                    ,0x53a,
                    "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
    }
    if (((((long)uVar13 < (long)p->pPars->nFastEdges) && (local_80 < iVar12)) && (local_7c != 0)) &&
       (iVar15 = p->pObjs[uVar6].Delay2 + iVar2, iVar15 < iVar12)) {
      pGVar8 = Gia_ManObj(p->pGia,uVar6);
      uVar6 = (uint)*(undefined8 *)pGVar8;
      if (((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0) ||
         (local_7c = 1, (((uint)((ulong)*(undefined8 *)pGVar8 >> 0x20) ^ uVar6) & 0x1fffffff) == 0))
      goto LAB_0061351a;
    }
    else {
LAB_0061351a:
      local_7c = 0;
      iVar15 = iVar12;
    }
    Of_CutSetFlag(pCut,iVar7,local_7c);
    if (iVar15 < *pDelay1) {
      iVar15 = *pDelay1;
    }
    *pDelay1 = iVar15;
    if (iVar12 < *pDelay2) {
      iVar12 = *pDelay2;
    }
    *pDelay2 = iVar12;
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void Of_ManComputeForwardDirconCut( Of_Man_t * p, int iObj, int * pCut, int * pDelay1, int * pDelay2 )
{
    // Delay1 - main delay;  Delay2 - precomputed LUT delay in terms of Delay1 for the fanins
    int Delays[6], Perm[6] = {0, 1, 2, 3, 4, 5}; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int DelayLut2 = p->pPars->nDelayLut2;
    int nSize = Of_CutSize(pCut);
    int k, iVar, Flag, SlowCon, Delay, DelayAfter, fDirConWorks;
    Of_CutForEachVar( pCut, iVar, k )
    {
        Delays[k] = Of_ObjDelay1(p, iVar) + DelayLut1;
//        printf( "%3d%s ", iVar, Flag ? "*" : " " );
    }
    for ( ; k < p->pPars->nLutSize; k++ )
    {
        Delays[k] = -ABC_INFINITY;
//        printf( "     " );
    }
    Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
    assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
    assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
    // consider speedup due to dircons
    fDirConWorks = 1;
    *pDelay1 = *pDelay2 = 0;
    SlowCon = p->pPars->nFastEdges < nSize ? Delays[p->pPars->nFastEdges] : 0;
    for ( k = 0; k < nSize; k++ )
    {
        // use dircon if the following is true
        // - the input is eligible for dircon (does not exceed the limit)
        // - there is an expected gain in delay, compared the largest delay without dircon
        // - the dircon delay is indeed lower than the largest delay without dircon
        // - all previous dircons worked out well
        // - the node is an AND-gate 
        iVar = Of_CutVar( pCut, Perm[k] );
        assert( Delays[k] == Of_ObjDelay1(p, iVar) + DelayLut1 );
        DelayAfter = Of_ObjDelay2(p, iVar) + DelayLut2;
        if ( k < p->pPars->nFastEdges && Delays[k] > SlowCon && DelayAfter < Delays[k] && fDirConWorks && Gia_ObjIsAndNotBuf(Gia_ManObj(p->pGia, iVar)) )
        {
            Delay = DelayAfter;
            Of_CutSetFlag( pCut, Perm[k], 1 );
        }
        else
        {
            Delay = Delays[k];// + DelayLut2;
            Of_CutSetFlag( pCut, Perm[k], 0 );
            fDirConWorks = 0;
        }
        *pDelay1 = Abc_MaxInt( *pDelay1, Delay );
        *pDelay2 = Abc_MaxInt( *pDelay2, Delays[k] );
    }
//    printf( "   %5.2f",   Of_Int2Flt(*pDelay1) );
//    printf( "   %5.2f\n", Of_Int2Flt(*pDelay2) );
    // do not use the structure if simple LUT is better
    if ( *pDelay1 > *pDelay2 )
    {
        for ( k = 0; k < nSize; k++ )
            Of_CutSetFlag( pCut, k, 0 );
        *pDelay1 = *pDelay2;
    }
    assert( *pDelay1 <= *pDelay2 );
    Of_CutSetDelay1( pCut, *pDelay1 );
    Of_CutSetDelay2( pCut, *pDelay2 );
    // verify
    Of_CutForEachVarFlag( pCut, iVar, Flag, k )
    {
        if ( Flag )
            assert( Of_ObjDelay2(p, iVar) + DelayLut2 <= *pDelay1 );
        else
            assert( Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay1 );
        assert( Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay2 );
    }
}